

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

void joypad_init(gb_joypad_t *joypad,gb *gb)

{
  if (joypad == (gb_joypad_t *)0x0) {
    __assert_fail("joypad != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/joypad.c"
                  ,10,"void joypad_init(gb_joypad_t *, struct gb *)");
  }
  if (gb != (gb *)0x0) {
    joypad->gb = gb;
    joypad->state = 0;
    joypad->reg_joyp = 0xcf;
    return;
  }
  __assert_fail("gb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/joypad.c"
                ,0xb,"void joypad_init(gb_joypad_t *, struct gb *)");
}

Assistant:

void joypad_init(gb_joypad_t *joypad, struct gb *gb)
{
    assert(joypad != NULL);
    assert(gb != NULL);

    joypad->gb = gb;

    joypad_reset(joypad);
}